

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       list_caster<std::vector<std::tuple<long,long,std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>,std::allocator<std::tuple<long,long,std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>>>,std::tuple<long,long,std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>>
       ::
       cast<std::vector<std::tuple<long,long,std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>,std::allocator<std::tuple<long,long,std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>>>>
                 (vector<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>,_std::allocator<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  pointer ptVar1;
  handle hVar2;
  long lVar3;
  PyObject *tmp;
  pointer ptVar4;
  list l;
  object value_;
  
  list::list(&l,((long)(src->
                       super__Vector_base<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>,_std::allocator<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(src->
                      super__Vector_base<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>,_std::allocator<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x28);
  ptVar4 = (src->
           super__Vector_base<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>,_std::allocator<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (src->
           super__Vector_base<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>,_std::allocator<std::tuple<long,_long,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0;
  do {
    hVar2.m_ptr = (PyObject *)l.super_object.super_handle.m_ptr;
    if (ptVar4 == ptVar1) {
      l.super_object.super_handle.m_ptr = (object)(handle)0x0;
      goto LAB_001a1dca;
    }
    hVar2 = tuple_caster<std::tuple,long,long,std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>
            ::
            cast_impl<std::tuple<long,long,std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>,0ul,1ul,2ul>
                      (ptVar4,policy,parent.m_ptr);
    value_.super_handle = hVar2;
    if (hVar2.m_ptr != (PyObject *)0x0) {
      value_.super_handle.m_ptr = (handle)(PyObject *)0x0;
      if ((*(byte *)(*(long *)((long)l.super_object.super_handle.m_ptr + 8) + 0xab) & 2) == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<std::tuple<long, long, std::vector<std::tuple<double, double, double>>>>, std::tuple<long, long, std::vector<std::tuple<double, double, double>>>>::cast(T &&, return_value_policy, handle) [Type = std::vector<std::tuple<long, long, std::vector<std::tuple<double, double, double>>>>, Value = std::tuple<long, long, std::vector<std::tuple<double, double, double>>>, T = std::vector<std::tuple<long, long, std::vector<std::tuple<double, double, double>>>>]"
                     );
      }
      *(PyObject **)(*(long *)((long)l.super_object.super_handle.m_ptr + 0x18) + lVar3 * 8) =
           hVar2.m_ptr;
      lVar3 = lVar3 + 1;
    }
    pybind11::object::~object(&value_);
    ptVar4 = ptVar4 + 1;
  } while (hVar2.m_ptr != (PyObject *)0x0);
  hVar2.m_ptr = (PyObject *)0x0;
LAB_001a1dca:
  pybind11::object::~object(&l.super_object);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }